

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn.c
# Opt level: O3

int pt_insn_is_far_branch(pt_insn *insn,pt_insn_ext *iext)

{
  if (insn != (pt_insn *)0x0) {
    return (int)(insn->iclass - ptic_far_call < 3);
  }
  return 0;
}

Assistant:

int pt_insn_is_far_branch(const struct pt_insn *insn,
			  const struct pt_insn_ext *iext)
{
	(void) iext;

	if (!insn)
		return 0;

	switch (insn->iclass) {
	default:
		return 0;

	case ptic_far_call:
	case ptic_far_return:
	case ptic_far_jump:
		return 1;
	}
}